

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::SMDImporter::ParseUnsignedInt
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,uint *out)

{
  byte *pbVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  
  do {
    uVar3 = (ulong)(byte)*szCurrent;
    if (0x20 < uVar3) {
LAB_00601114:
      bVar2 = true;
LAB_006010d3:
      if (bVar2) {
        uVar4 = 0;
        if (0xf5 < (byte)(*szCurrent - 0x3aU)) {
          uVar4 = 0;
          do {
            uVar4 = (uint)(byte)((char)uVar3 - 0x30) + uVar4 * 10;
            pbVar1 = (byte *)szCurrent + 1;
            uVar3 = (ulong)*pbVar1;
            szCurrent = (char *)((byte *)szCurrent + 1);
          } while (0xf5 < (byte)(*pbVar1 - 0x3a));
        }
        if (szCurrentOut != (char **)0x0) {
          *szCurrentOut = szCurrent;
        }
        *out = uVar4;
      }
      return bVar2;
    }
    if ((0x100000200U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar3 & 0x3f) & 1) != 0) {
        bVar2 = false;
        goto LAB_006010d3;
      }
      goto LAB_00601114;
    }
    szCurrent = (char *)((byte *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseUnsignedInt(const char* szCurrent, const char** szCurrentOut, unsigned int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtoul10(szCurrent,szCurrentOut);
    return true;
}